

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  long *local_218;
  long local_208;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  int local_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ShaderMatrixCase *local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar5;
  
  local_1f4 = programID;
  local_1d0 = this;
  iVar4 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  lVar10 = 0x128;
  lVar7 = 0;
  bVar8 = true;
  do {
    if (*(int *)((long)&(local_1d0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar10) == 1) {
      pcVar2 = *(code **)(lVar5 + 0xb48);
      local_1f0 = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"u_in","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,(int)lVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar9 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar9 = local_1e0[0];
      }
      if (uVar9 < (ulong)(local_1c0 + local_1e8)) {
        uVar9 = 0xf;
        if (local_1c8 != local_1b8) {
          uVar9 = local_1b8[0];
        }
        if (uVar9 < (ulong)(local_1c0 + local_1e8)) goto LAB_0109ae73;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0);
      }
      else {
LAB_0109ae73:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1c8);
      }
      local_218 = &local_208;
      plVar1 = puVar6 + 2;
      if ((long *)*puVar6 == plVar1) {
        local_208 = *plVar1;
        uStack_200 = *(undefined4 *)(puVar6 + 3);
        uStack_1fc = *(undefined4 *)((long)puVar6 + 0x1c);
      }
      else {
        local_208 = *plVar1;
        local_218 = (long *)*puVar6;
      }
      *puVar6 = plVar1;
      puVar6[1] = 0;
      *(undefined1 *)plVar1 = 0;
      iVar4 = (*pcVar2)(local_1f4,local_218);
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if (-1 < iVar4) {
        switch(*(undefined4 *)
                ((long)&(local_1d0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar10 + 4)) {
        case 1:
          (**(code **)(lVar5 + 0x14e0))((&s_constInFloat)[lVar7],iVar4);
          break;
        case 2:
          (**(code **)(lVar5 + 0x1528))(iVar4,1,s_constInVec2 + lVar7 * 8);
          break;
        case 3:
          (**(code **)(lVar5 + 0x1568))(iVar4,1,s_constInVec3 + lVar7 * 0xc);
          break;
        case 4:
          (**(code **)(lVar5 + 0x15a8))(iVar4,1,s_constInVec4 + lVar7 * 0x10);
          break;
        case 5:
          (**(code **)(lVar5 + 0x15e0))(iVar4,1,1,s_constInMat2x2 + lVar7 * 0x10);
          break;
        case 6:
          (**(code **)(lVar5 + 0x15f0))(iVar4,1,1,&s_constInMat2x3 + lVar7 * 6);
          break;
        case 7:
          (**(code **)(lVar5 + 0x1600))(iVar4,1,1,s_constInMat2x4 + lVar7 * 0x20);
          break;
        case 8:
          (**(code **)(lVar5 + 0x1620))(iVar4,1,1,&s_constInMat3x2 + lVar7 * 6);
          break;
        case 9:
          (**(code **)(lVar5 + 0x1610))(iVar4,1,1,&s_constInMat3x3 + lVar7 * 9);
          break;
        case 10:
          (**(code **)(lVar5 + 0x1630))(iVar4,1,1,&s_constInMat3x4 + lVar7 * 0xc);
          break;
        case 0xb:
          (**(code **)(lVar5 + 0x1650))(iVar4,1,1,&s_constInMat4x2 + lVar7 * 8);
          break;
        case 0xc:
          (**(code **)(lVar5 + 0x1660))(iVar4,1,1,&s_constInMat4x3 + lVar7 * 0xc);
          break;
        case 0xd:
          (**(code **)(lVar5 + 0x1640))(iVar4,1,1,&s_constInMat4x4 + lVar7 * 0x10);
        }
      }
    }
    lVar7 = 1;
    lVar10 = 0x134;
    bVar3 = !bVar8;
    bVar8 = false;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);						break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv	(loc, 1, GL_TRUE, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(loc, 1, GL_TRUE, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(loc, 1, GL_TRUE, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(loc, 1, GL_TRUE, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv	(loc, 1, GL_TRUE, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(loc, 1, GL_TRUE, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(loc, 1, GL_TRUE, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(loc, 1, GL_TRUE, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv	(loc, 1, GL_TRUE, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}